

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::RigidBody(RigidBody *this)

{
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffffb8;
  ObjectType in_stack_ffffffffffffffbc;
  StuntDouble *in_stack_ffffffffffffffc0;
  
  StuntDouble::StuntDouble(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,0x278a82);
  *in_RDI = &PTR__RigidBody_00501680;
  std::__cxx11::string::string((string *)(in_RDI + 0xf));
  SquareMatrix3<double>::SquareMatrix3
            ((SquareMatrix3<double> *)in_stack_ffffffffffffffc0,
             (double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x278ad0);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
            ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)0x278ae8);
  Vector3<double>::Vector3((Vector3<double> *)0x278af9);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x278b0c)
  ;
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  vector((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> *)
         0x278b1d);
  return;
}

Assistant:

RigidBody::RigidBody() :
      StuntDouble(otRigidBody, &Snapshot::rigidbodyData), inertiaTensor_(0.0) {}